

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::reverseBits(APInt *this)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  unsigned_long val;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar6;
  APInt *in_RSI;
  APInt AVar7;
  uint local_30;
  uint S;
  APInt Val;
  APInt *this_local;
  APInt *Reversed;
  
  uVar1 = in_RSI->BitWidth;
  if (uVar1 == 8) {
    uVar1 = in_RSI->BitWidth;
    bVar2 = reverseBits<unsigned_char>((uchar)(in_RSI->U).VAL);
    APInt(this,uVar1,(ulong)bVar2,false);
    uVar6 = extraout_RDX_02;
  }
  else if (uVar1 == 0x10) {
    uVar1 = in_RSI->BitWidth;
    uVar4 = reverseBits<unsigned_short>((unsigned_short)(in_RSI->U).VAL);
    APInt(this,uVar1,(ulong)uVar4,false);
    uVar6 = extraout_RDX_01;
  }
  else if (uVar1 == 0x20) {
    uVar1 = in_RSI->BitWidth;
    uVar5 = reverseBits<unsigned_int>((uint)(in_RSI->U).VAL);
    APInt(this,uVar1,(ulong)uVar5,false);
    uVar6 = extraout_RDX_00;
  }
  else if (uVar1 == 0x40) {
    uVar1 = in_RSI->BitWidth;
    val = reverseBits<unsigned_long>((in_RSI->U).VAL);
    APInt(this,uVar1,val,false);
    uVar6 = extraout_RDX;
  }
  else {
    APInt((APInt *)&S,in_RSI);
    APInt(this,in_RSI->BitWidth,0,false);
    local_30 = in_RSI->BitWidth;
    while (bVar3 = operator!=((APInt *)&S,0), bVar3) {
      operator<<=(this,1);
      bVar3 = operator[]((APInt *)&S,0);
      operator|=(this,(ulong)bVar3);
      local_30 = local_30 - 1;
      lshrInPlace((APInt *)&S,1);
    }
    operator<<=(this,local_30);
    ~APInt((APInt *)&S);
    uVar6 = extraout_RDX_03;
  }
  AVar7._8_8_ = uVar6;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::reverseBits() const {
  switch (BitWidth) {
  case 64:
    return APInt(BitWidth, llvm::reverseBits<uint64_t>(U.VAL));
  case 32:
    return APInt(BitWidth, llvm::reverseBits<uint32_t>(U.VAL));
  case 16:
    return APInt(BitWidth, llvm::reverseBits<uint16_t>(U.VAL));
  case 8:
    return APInt(BitWidth, llvm::reverseBits<uint8_t>(U.VAL));
  default:
    break;
  }

  APInt Val(*this);
  APInt Reversed(BitWidth, 0);
  unsigned S = BitWidth;

  for (; Val != 0; Val.lshrInPlace(1)) {
    Reversed <<= 1;
    Reversed |= Val[0];
    --S;
  }

  Reversed <<= S;
  return Reversed;
}